

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

void __thiscall
NLReaderTest_ReadInvalidNumericExpr_Test::TestBody(NLReaderTest_ReadInvalidNumericExpr_Test *this)

{
  bool bVar1;
  char *pcVar2;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  AssertHelper local_e0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8 [2];
  long local_c8 [2];
  AssertionResult local_b8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  testing::AssertionSuccess();
  if (local_b8.success_ == true) {
    local_d8[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"(input):18:1: expected expression","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"C0\nx\n","");
      ReadNL(&local_48,&local_88,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    testing::AssertionResult::operator<<
              (&local_b8,
               (char (*) [96])
               "Expected: ReadNL(\"C0\\nx\\n\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if (local_d8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
      operator_delete(local_d8[0].ptr_,local_c8[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_d8);
  if (local_b8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x50b,pcVar2);
  testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_d8);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  if (local_d8[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_d8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8[0].ptr_ + 8))();
    }
    local_d8[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  testing::AssertionSuccess();
  if (local_b8.success_ == true) {
    local_d8[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"(input):18:2: expected numeric expression opcode","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"C0\no22\nv1\nn0\n","");
      ReadNL(&local_68,&local_a8,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    testing::AssertionResult::operator<<
              (&local_b8,
               (char (*) [106])
               "Expected: ReadNL(\"C0\\no22\\nv1\\nn0\\n\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if (local_d8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
      operator_delete(local_d8[0].ptr_,local_c8[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_d8);
  if (local_b8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x50d,pcVar2);
  testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_d8);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  if (local_d8[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_d8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8[0].ptr_ + 8))();
    }
    local_d8[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(NLReaderTest, ReadInvalidNumericExpr) {
  EXPECT_READ_ERROR("C0\nx\n", "(input):18:1: expected expression");
  EXPECT_READ_ERROR("C0\no22\nv1\nn0\n",
        "(input):18:2: expected numeric expression opcode");
}